

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::emit_spv_amd_shader_trinary_minmax_op
          (CompilerMSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t count)

{
  bool bVar1;
  CompilerError *this_00;
  AMDShaderTrinaryMinMax op;
  uint32_t count_local;
  uint32_t *args_local;
  uint32_t eop_local;
  uint32_t id_local;
  uint32_t result_type_local;
  CompilerMSL *this_local;
  
  bVar1 = Options::supports_msl_version(&this->msl_options,2,1,0);
  if (!bVar1) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Trinary min/max functions require MSL 2.1.");
    __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  if (eop - 7 < 3) {
    CompilerGLSL::emit_trinary_func_op
              (&this->super_CompilerGLSL,result_type,id,*args,args[1],args[2],"median3");
  }
  else {
    CompilerGLSL::emit_spv_amd_shader_trinary_minmax_op
              (&this->super_CompilerGLSL,result_type,id,eop,args,count);
  }
  return;
}

Assistant:

void CompilerMSL::emit_spv_amd_shader_trinary_minmax_op(uint32_t result_type, uint32_t id, uint32_t eop,
                                                        const uint32_t *args, uint32_t count)
{
	enum AMDShaderTrinaryMinMax
	{
		FMin3AMD = 1,
		UMin3AMD = 2,
		SMin3AMD = 3,
		FMax3AMD = 4,
		UMax3AMD = 5,
		SMax3AMD = 6,
		FMid3AMD = 7,
		UMid3AMD = 8,
		SMid3AMD = 9
	};

	if (!msl_options.supports_msl_version(2, 1))
		SPIRV_CROSS_THROW("Trinary min/max functions require MSL 2.1.");

	auto op = static_cast<AMDShaderTrinaryMinMax>(eop);

	switch (op)
	{
	case FMid3AMD:
	case UMid3AMD:
	case SMid3AMD:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "median3");
		break;
	default:
		CompilerGLSL::emit_spv_amd_shader_trinary_minmax_op(result_type, id, eop, args, count);
		break;
	}
}